

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O3

int StateDiscardPileSize(pyhanabi_state_t *state)

{
  void *pvVar1;
  
  if (state == (pyhanabi_state_t *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x16f,"int StateDiscardPileSize(pyhanabi_state_t *)");
  }
  pvVar1 = state->state;
  if (pvVar1 != (void *)0x0) {
    return (int)((ulong)(*(long *)((long)pvVar1 + 0x30) - *(long *)((long)pvVar1 + 0x28)) >> 3);
  }
  __assert_fail("state->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x170,"int StateDiscardPileSize(pyhanabi_state_t *)");
}

Assistant:

int StateDiscardPileSize(pyhanabi_state_t* state) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  return reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state)
      ->DiscardPile()
      .size();
}